

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.cpp
# Opt level: O1

Matrix4d * __thiscall Pose::getT(Matrix4d *__return_storage_ptr__,Pose *this)

{
  double dVar1;
  double *pdVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar3;
  long lVar4;
  Scalar *dst_ptr;
  Matrix4d *local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Vector4d local_78;
  Matrix3d local_58;
  
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (this->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
       array[0];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       (this->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
       array[1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       (this->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
       array[2];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       (this->rot).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
       array[3];
  QtoR(&local_58,this,&local_78);
  local_a8 = 0;
  local_a0 = 3;
  local_98 = 3;
  pdVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
           m_storage.m_data.array + 2;
  lVar4 = 0x10;
  do {
    dVar1 = *(double *)
             ((long)local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                    m_data.array + lVar4 + -8);
    ((plain_array<double,_16,_0,_16> *)(pdVar2 + -2))->array[0] =
         *(double *)
          ((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                 m_data.array + lVar4 + 0x10);
    pdVar2[-1] = dVar1;
    *pdVar2 = *(double *)
               ((long)local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + lVar4);
    lVar4 = lVar4 + 0x18;
    pdVar2 = pdVar2 + 4;
  } while (lVar4 != 0x58);
  local_b0 = __return_storage_ptr__;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,4,4,0,4,4>> *)&local_b0,
                      (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this);
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&local_78);
  local_80 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_80);
  local_88 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_88);
  local_90 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,&local_90);
  if ((local_98 + local_a8 == 4) && (local_a0 == 4)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 4>>::finished() [MatrixType = Eigen::Matrix<double, 4, 4>]"
               );
}

Assistant:

Matrix4d Pose::getT(){
      Matrix4d T;
      T <<  this->getR(), this->pos,
            0, 0, 0, 1;
      return T;
}